

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O1

void __thiscall chrono::turtlebot::Turtlebot_Part::AddCollisionShapes(Turtlebot_Part *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long *plVar3;
  long *plVar4;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string vis_mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8;
  long lStack_c0;
  long lStack_b8;
  long lStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined1 local_68 [32];
  undefined8 uStack_48;
  undefined8 local_28;
  
  std::operator+(&local_128,"robot/turtlebot/",&this->m_mesh_name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    lStack_b8 = *plVar4;
    lStack_b0 = plVar3[3];
    local_c8 = &lStack_b8;
  }
  else {
    lStack_b8 = *plVar4;
    local_c8 = (long *)*plVar3;
  }
  lStack_c0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_e8);
  if (local_c8 != &lStack_b8) {
    operator_delete(local_c8,lStack_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_128,SUB81(local_e8,0),false);
  local_80 = (this->m_offset).m_data[0];
  local_78 = (this->m_offset).m_data[1];
  local_70 = (this->m_offset).m_data[2];
  stack0xffffffffffffffa0 = SUB6456(ZEXT864(0),4);
  local_68._0_8_ = 0x3ff0000000000000;
  _local_68 = ZEXT4064(CONCAT832(0x3ff0000000000000,local_68));
  local_28 = 0x3ff0000000000000;
  (**(code **)(*(long *)local_128._M_dataplus._M_p + 0x80))();
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar3 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar3 + 0x18))();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar3 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_f8 = (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_f0 = (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f0->_M_use_count = local_f0->_M_use_count + 1;
    }
  }
  local_108 = (long *)local_128._M_dataplus._M_p;
  local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_128._M_string_length + 8) =
           *(_Atomic_word *)(local_128._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_128._M_string_length + 8) =
           *(_Atomic_word *)(local_128._M_string_length + 8) + 1;
    }
  }
  lStack_c0 = 0;
  lStack_b8 = 0;
  lStack_b0 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_c8 = (long *)0x3ff0000000000000;
  uStack_a8 = 0x3ff0000000000000;
  local_88 = 0x3ff0000000000000;
  (**(code **)(*plVar3 + 0x80))(plVar3,&local_f8,&local_108,0,0,&VNULL,&local_c8);
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar3 = *(long **)(peVar1 + 0x198);
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 0x1a0);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar3 + 0x20))();
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  chrono::ChBody::SetCollide
            (SUB81((this->m_body).
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  return;
}

Assistant:

void Turtlebot_Part::AddCollisionShapes() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(m_offset, ChMatrix33<>(1));

    m_body->GetCollisionModel()->ClearModel();
    m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh, false, false, VNULL, ChMatrix33<>(1), 0.005);
    m_body->GetCollisionModel()->BuildModel();
    m_body->SetCollide(m_collide);
}